

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O3

bool __thiscall
CppJieba::HMMSegment::cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  ushort *puVar1;
  bool bVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  char cVar6;
  ushort *puVar7;
  ulong uVar8;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  words;
  string tmp;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_68;
  value_type local_50;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                  ,0x5d,
                  "virtual bool CppJieba::HMMSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  if (begin._M_current == end._M_current) {
    bVar2 = false;
  }
  else {
    local_68.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = cut(this,begin,end,&local_68);
    if (bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      if (local_68.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_68.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar8 = 0;
        pvVar3 = local_68.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = local_68.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          puVar7 = pvVar3[uVar8].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = pvVar3[uVar8].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (puVar7 < puVar1) {
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
            do {
              cVar6 = (char)&local_50;
              if (0x7f < *puVar7) {
                if (*puVar7 < 0x800) {
                  std::__cxx11::string::push_back(cVar6);
                }
                else {
                  std::__cxx11::string::push_back(cVar6);
                  std::__cxx11::string::push_back(cVar6);
                }
              }
              std::__cxx11::string::push_back(cVar6);
              puVar7 = puVar7 + 1;
            } while (puVar7 != puVar1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,&local_50);
            pvVar3 = local_68.
                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar4 = local_68.
                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar5 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
        } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    std::
    vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::~vector(&local_68);
  }
  return bVar2;
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<Unicode> words;
                if(!cut(begin, end, words))
                {
                    return false;
                }
                string tmp;
                for(uint i = 0; i < words.size(); i++)
                {
                    if(TransCode::encode(words[i], tmp))
                    {
                        res.push_back(tmp);
                    }
                }
                return true;
            }